

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  __m256i alVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  uint uVar7;
  bool bVar8;
  __m256i c;
  __m256i *palVar9;
  int iVar10;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar11;
  __m256i *palVar12;
  __m256i *b_00;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong size;
  ulong uVar16;
  ulong uVar17;
  __m256i *ptr;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int32_t column_len;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar68;
  undefined8 in_stack_fffffffffffffed8;
  longlong in_stack_fffffffffffffee0;
  undefined1 auVar38 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_table_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sw_table_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_avx2_256_64_cold_4();
        }
        else {
          uVar15 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_avx2_256_64_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_avx2_256_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_avx2_256_64_cold_1();
          }
          else {
            uVar1 = (ulong)uVar3 + 3;
            iVar10 = ppVar5->max;
            result = parasail_result_new_table1((uint)uVar1 & 0x7ffffffc,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 2;
              result->flag = result->flag | 0x4820804;
              b = parasail_memalign___m256i(0x20,size);
              palVar11 = parasail_memalign___m256i(0x20,size);
              palVar12 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              if ((b_00 != (__m256i *)0x0 && palVar12 != (__m256i *)0x0) &&
                  (palVar11 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
                auVar35._4_4_ = 0;
                auVar35._0_4_ = open;
                auVar35._8_4_ = open;
                auVar35._12_4_ = 0;
                auVar35._16_4_ = open;
                auVar35._20_4_ = 0;
                auVar35._24_4_ = open;
                auVar35._28_4_ = 0;
                auVar36._4_4_ = 0;
                auVar36._0_4_ = gap;
                auVar36._8_4_ = gap;
                auVar36._12_4_ = 0;
                auVar36._16_4_ = gap;
                auVar36._20_4_ = 0;
                auVar36._24_4_ = gap;
                auVar36._28_4_ = 0;
                alVar2[1]._0_4_ = in_stack_fffffffffffffed0;
                alVar2[0] = (longlong)result;
                alVar2[1]._4_4_ = in_stack_fffffffffffffed4;
                alVar2[2] = in_stack_fffffffffffffed8;
                alVar2[3] = in_stack_fffffffffffffee0;
                parasail_memset___m256i(b,alVar2,size);
                c[1]._0_4_ = in_stack_fffffffffffffed0;
                c[0] = (longlong)result;
                c[1]._4_4_ = in_stack_fffffffffffffed4;
                c[2] = in_stack_fffffffffffffed8;
                c[3] = in_stack_fffffffffffffee0;
                parasail_memset___m256i(b_00,c,size);
                uVar21 = 0;
                uVar7 = (uint)size;
                lVar27 = size * uVar15;
                uVar13 = 0xc000000000000000;
                auVar37._8_8_ = 0xc000000000000000;
                auVar37._0_8_ = 0xc000000000000000;
                auVar37._16_8_ = 0xc000000000000000;
                auVar37._24_8_ = 0xc000000000000000;
                auVar38 = ZEXT3264(auVar37);
                lVar34 = 0;
                uVar31 = 0;
                auVar42 = ZEXT3264(auVar37);
                do {
                  ptr = b;
                  iVar68 = ppVar5->mapper[(byte)s2[uVar31]];
                  palVar9 = palVar12;
                  b = palVar11;
                  if ((int)uVar21 == (int)uVar31 + -2) {
                    palVar9 = palVar11;
                    b = palVar12;
                  }
                  palVar12 = palVar9;
                  alVar2 = ptr[uVar7 - 1];
                  auVar37 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                  auVar37 = vpalignr_avx2((undefined1  [32])alVar2,auVar37,8);
                  lVar14 = 0;
                  auVar45 = ZEXT1664((undefined1  [16])0x0);
                  lVar32 = lVar34;
                  do {
                    auVar37 = vpaddq_avx2(auVar37,*(undefined1 (*) [32])
                                                   ((long)pvVar4 +
                                                   lVar14 + size * (long)iVar68 * 0x20));
                    uVar16 = *(ulong *)((long)*b_00 + lVar14);
                    if ((long)uVar16 < (long)auVar37._0_8_) {
                      uVar16 = auVar37._0_8_;
                    }
                    uVar18 = *(ulong *)((long)*b_00 + lVar14 + 8);
                    uVar22 = vpextrq_avx(auVar37._0_16_,1);
                    if ((long)uVar18 < (long)uVar22) {
                      uVar18 = uVar22;
                    }
                    uVar22 = *(ulong *)((long)*b_00 + lVar14 + 0x10);
                    if ((long)uVar22 < (long)auVar37._16_8_) {
                      uVar22 = auVar37._16_8_;
                    }
                    uVar25 = *(ulong *)((long)*b_00 + lVar14 + 0x18);
                    uVar23 = vpextrq_avx(auVar37._16_16_,1);
                    if ((long)uVar25 < (long)uVar23) {
                      uVar25 = uVar23;
                    }
                    if ((long)uVar16 <= (long)auVar45._0_8_) {
                      uVar16 = auVar45._0_8_;
                    }
                    uVar23 = vpextrq_avx(auVar45._0_16_,1);
                    if ((long)uVar18 <= (long)uVar23) {
                      uVar18 = uVar23;
                    }
                    if ((long)uVar22 <= (long)auVar45._16_8_) {
                      uVar22 = auVar45._16_8_;
                    }
                    uVar23 = vpextrq_avx(auVar45._16_16_,1);
                    auVar37 = *(undefined1 (*) [32])((long)*b_00 + lVar14);
                    if ((long)uVar25 <= (long)uVar23) {
                      uVar25 = uVar23;
                    }
                    uVar16 = ~((long)uVar16 >> 0x3f) & uVar16;
                    uVar18 = ~((long)uVar18 >> 0x3f) & uVar18;
                    uVar22 = ~((long)uVar22 >> 0x3f) & uVar22;
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = uVar18;
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = uVar16;
                    auVar48 = vpunpcklqdq_avx(auVar54,auVar48);
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = uVar22;
                    auVar44._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar48;
                    auVar44._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55;
                    uVar25 = ~((long)uVar25 >> 0x3f) & uVar25;
                    auVar60._8_8_ = uVar25;
                    auVar60._0_8_ = uVar25;
                    auVar60._16_8_ = uVar25;
                    auVar60._24_8_ = uVar25;
                    auVar44 = vpblendd_avx2(auVar44,auVar60,0xc0);
                    *(undefined1 (*) [32])((long)*b + lVar14) = auVar44;
                    piVar6 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + lVar32) = (int)uVar16;
                    uVar23 = auVar42._0_8_;
                    if ((long)auVar42._0_8_ < (long)uVar16) {
                      uVar23 = uVar16;
                    }
                    uVar16 = vpextrq_avx(auVar42._0_16_,1);
                    *(int *)((long)piVar6 + lVar27 * 4 + lVar32) = (int)uVar18;
                    if ((long)uVar16 < (long)uVar18) {
                      uVar16 = uVar18;
                    }
                    *(int *)((long)piVar6 + lVar27 * 8 + lVar32) = (int)uVar22;
                    uVar18 = auVar42._16_8_;
                    if ((long)auVar42._16_8_ < (long)uVar22) {
                      uVar18 = uVar22;
                    }
                    uVar22 = vpextrq_avx(auVar42._16_16_,1);
                    *(int *)((long)piVar6 + lVar27 * 0xc + lVar32) = (int)uVar25;
                    if ((long)uVar22 < (long)uVar25) {
                      uVar22 = uVar25;
                    }
                    auVar44 = vpsubq_avx2(auVar44,auVar35);
                    auVar37 = vpsubq_avx2(auVar37,auVar36);
                    uVar25 = auVar44._0_8_;
                    uVar19 = auVar37._0_8_;
                    if ((long)auVar37._0_8_ <= (long)uVar25) {
                      uVar19 = uVar25;
                    }
                    uVar28 = vpextrq_avx(auVar37._0_16_,1);
                    uVar33 = vpextrq_avx(auVar44._0_16_,1);
                    if ((long)uVar28 <= (long)uVar33) {
                      uVar28 = uVar33;
                    }
                    uVar17 = auVar44._16_8_;
                    uVar26 = auVar37._16_8_;
                    if ((long)auVar37._16_8_ <= (long)uVar17) {
                      uVar26 = uVar17;
                    }
                    uVar30 = vpextrq_avx(auVar37._16_16_,1);
                    uVar24 = vpextrq_avx(auVar44._16_16_,1);
                    if ((long)uVar30 <= (long)uVar24) {
                      uVar30 = uVar24;
                    }
                    auVar37 = vpsubq_avx2(auVar45._0_32_,auVar36);
                    if ((long)uVar25 < (long)auVar37._0_8_) {
                      uVar25 = auVar37._0_8_;
                    }
                    uVar29 = vpextrq_avx(auVar37._0_16_,1);
                    if ((long)uVar33 < (long)uVar29) {
                      uVar33 = uVar29;
                    }
                    if ((long)uVar17 < (long)auVar37._16_8_) {
                      uVar17 = auVar37._16_8_;
                    }
                    uVar29 = vpextrq_avx(auVar37._16_16_,1);
                    if ((long)uVar24 < (long)uVar29) {
                      uVar24 = uVar29;
                    }
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = uVar22;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar18;
                    auVar48 = vpunpcklqdq_avx(auVar46,auVar39);
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar16;
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = uVar23;
                    auVar54 = vpunpcklqdq_avx(auVar56,auVar49);
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = uVar28;
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = uVar19;
                    auVar55 = vpunpcklqdq_avx(auVar62,auVar61);
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = uVar26;
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = uVar30;
                    auVar39 = vpunpcklqdq_avx(auVar43,auVar63);
                    *(undefined1 (*) [16])((long)*b_00 + lVar14 + 0x10) = auVar39;
                    *(undefined1 (*) [16])((long)*b_00 + lVar14) = auVar55;
                    auVar42 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar48,
                                                  ZEXT116(0) * auVar48 + ZEXT116(1) * auVar54));
                    auVar64._8_8_ = 0;
                    auVar64._0_8_ = uVar24;
                    auVar65._8_8_ = 0;
                    auVar65._0_8_ = uVar17;
                    auVar48 = vpunpcklqdq_avx(auVar65,auVar64);
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = uVar33;
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = uVar25;
                    auVar54 = vpunpcklqdq_avx(auVar67,auVar66);
                    auVar45 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar48,
                                                  ZEXT116(0) * auVar48 + ZEXT116(1) * auVar54));
                    auVar37 = *(undefined1 (*) [32])((long)*ptr + lVar14);
                    lVar14 = lVar14 + 0x20;
                    lVar32 = lVar32 + uVar15 * 4;
                  } while (size << 5 != lVar14);
                  iVar68 = 0;
                  do {
                    auVar44 = auVar45._0_32_;
                    auVar37 = vperm2i128_avx2(auVar44,auVar44,8);
                    auVar37 = vpalignr_avx2(auVar44,auVar37,8);
                    auVar45 = ZEXT3264(auVar37);
                    lVar14 = 0;
                    lVar32 = lVar34;
                    do {
                      uVar16 = *(ulong *)((long)*b + lVar14);
                      uVar18 = auVar45._0_8_;
                      if ((long)auVar45._0_8_ < (long)uVar16) {
                        uVar18 = uVar16;
                      }
                      uVar16 = *(ulong *)((long)*b + lVar14 + 8);
                      uVar22 = vpextrq_avx(auVar45._0_16_,1);
                      if ((long)uVar22 < (long)uVar16) {
                        uVar22 = uVar16;
                      }
                      uVar16 = *(ulong *)((long)*b + lVar14 + 0x10);
                      uVar25 = auVar45._16_8_;
                      if ((long)auVar45._16_8_ < (long)uVar16) {
                        uVar25 = uVar16;
                      }
                      auVar50._8_8_ = 0;
                      auVar50._0_8_ = uVar22;
                      auVar57._8_8_ = 0;
                      auVar57._0_8_ = uVar18;
                      auVar48 = vpunpcklqdq_avx(auVar57,auVar50);
                      auVar58._8_8_ = 0;
                      auVar58._0_8_ = uVar25;
                      auVar53._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar48;
                      auVar53._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
                      uVar16 = *(ulong *)((long)*b + lVar14 + 0x18);
                      uVar23 = vpextrq_avx(auVar45._16_16_,1);
                      if ((long)uVar23 < (long)uVar16) {
                        uVar23 = uVar16;
                      }
                      auVar47._8_8_ = uVar23;
                      auVar47._0_8_ = uVar23;
                      auVar47._16_8_ = uVar23;
                      auVar47._24_8_ = uVar23;
                      auVar37 = vpblendd_avx2(auVar53,auVar47,0xc0);
                      *(undefined1 (*) [32])((long)*b + lVar14) = auVar37;
                      piVar6 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar6 + lVar32) = (int)uVar18;
                      *(int *)((long)piVar6 + lVar27 * 4 + lVar32) = (int)uVar22;
                      *(int *)((long)piVar6 + lVar27 * 8 + lVar32) = (int)uVar25;
                      if ((long)uVar18 <= (long)auVar42._0_8_) {
                        uVar18 = auVar42._0_8_;
                      }
                      uVar16 = vpextrq_avx(auVar42._0_16_,1);
                      if ((long)uVar22 <= (long)uVar16) {
                        uVar22 = uVar16;
                      }
                      if ((long)uVar25 <= (long)auVar42._16_8_) {
                        uVar25 = auVar42._16_8_;
                      }
                      *(int *)((long)piVar6 + lVar27 * 0xc + lVar32) = (int)uVar23;
                      uVar16 = vpextrq_avx(auVar42._16_16_,1);
                      if ((long)uVar23 <= (long)uVar16) {
                        uVar23 = uVar16;
                      }
                      auVar40._8_8_ = 0;
                      auVar40._0_8_ = uVar23;
                      auVar51._8_8_ = 0;
                      auVar51._0_8_ = uVar25;
                      auVar48 = vpunpcklqdq_avx(auVar51,auVar40);
                      auVar52._8_8_ = 0;
                      auVar52._0_8_ = uVar22;
                      auVar59._8_8_ = 0;
                      auVar59._0_8_ = uVar18;
                      auVar54 = vpunpcklqdq_avx(auVar59,auVar52);
                      auVar41._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar54;
                      auVar41._16_16_ = ZEXT116(1) * auVar48;
                      auVar42 = ZEXT3264(auVar41);
                      auVar37 = vpsubq_avx2(auVar37,auVar35);
                      auVar44 = vpsubq_avx2(auVar45._0_32_,auVar36);
                      auVar45 = ZEXT3264(auVar44);
                      auVar37 = vpcmpgtq_avx2(auVar44,auVar37);
                      if ((((auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar37 >> 0x7f,0) == '\0') && SUB321(auVar37 >> 0xbf,0) == '\0')
                          && -1 < auVar37[0x1f]) goto LAB_007957f8;
                      lVar14 = lVar14 + 0x20;
                      lVar32 = lVar32 + uVar15 * 4;
                    } while (size << 5 != lVar14);
                    iVar68 = iVar68 + 1;
                  } while (iVar68 != 4);
LAB_007957f8:
                  auVar37 = vpcmpgtq_avx2(auVar41,auVar38._0_32_);
                  bVar8 = true;
                  if ((((auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar37 >> 0x7f,0) != '\0') || SUB321(auVar37 >> 0xbf,0) != '\0') ||
                      auVar37[0x1f] < '\0') {
                    if ((long)uVar18 < (long)uVar25) {
                      uVar18 = uVar25;
                    }
                    if ((long)uVar22 < (long)uVar23) {
                      uVar22 = uVar23;
                    }
                    uVar13 = uVar22;
                    if ((long)uVar22 <= (long)uVar18) {
                      uVar13 = uVar18;
                    }
                    if ((long)(~(long)iVar10 + 0x7fffffffffffffffU) < (long)uVar13) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      bVar8 = false;
                    }
                    else {
                      auVar38 = ZEXT3264(CONCAT824(uVar13,CONCAT816(uVar13,CONCAT88(uVar13,uVar13)))
                                        );
                      uVar21 = uVar31 & 0xffffffff;
                    }
                  }
                  iVar68 = (int)uVar31;
                  if (!bVar8) break;
                  uVar31 = uVar31 + 1;
                  lVar34 = lVar34 + 4;
                  palVar11 = ptr;
                  iVar68 = s2Len;
                } while (uVar31 != uVar15);
                if (uVar13 == 0x7fffffffffffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar10 = parasail_result_is_saturated(result);
                palVar11 = palVar12;
                if (iVar10 == 0) {
                  iVar10 = (int)uVar21;
                  palVar9 = ptr;
                  if (iVar10 == iVar68 + -2) {
                    palVar11 = ptr;
                    palVar9 = palVar12;
                  }
                  if (iVar10 == iVar68 + -1) {
                    palVar11 = b;
                    b = palVar12;
                    palVar9 = ptr;
                  }
                  ptr = palVar9;
                  iVar68 = uVar3 - 1;
                  if ((uVar1 & 0x7ffffffc) != 0) {
                    uVar15 = 0;
                    do {
                      if (((*palVar11)[uVar15] == uVar13) &&
                         (iVar20 = ((uint)uVar15 & 3) * uVar7 + ((uint)(uVar15 >> 2) & 0x3fffffff),
                         iVar20 < iVar68)) {
                        iVar68 = iVar20;
                      }
                      uVar15 = uVar15 + 1;
                    } while ((uVar7 & 0x1fffffff) << 2 != (int)uVar15);
                  }
                }
                else {
                  iVar10 = 0;
                  uVar13 = 0xffffffff;
                  iVar68 = 0;
                }
                result->score = (int)uVar13;
                result->end_query = iVar68;
                result->end_ref = iVar10;
                parasail_free(b_00);
                parasail_free(palVar11);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int64_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}